

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxhash.c
# Opt level: O3

LispPTR STRING_EQUAL_HASHBITS(LispPTR object)

{
  ulong uVar1;
  ushort uVar2;
  uint uVar3;
  uint *puVar4;
  ulong uVar5;
  uint uVar6;
  DLword *pDVar7;
  
  uVar1 = (ulong)object;
  uVar2 = *(ushort *)((ulong)((object >> 9) * 2) + (long)MDStypetbl ^ 2) & 0x7ff;
  if (uVar2 < 0x10) {
    if (uVar2 != 4) {
      if (uVar2 == 0xe) goto LAB_00132b02;
LAB_00132b2e:
      uVar6 = object >> 9 & 0x7f ^ object << 3 ^ object >> 0x10;
      goto LAB_00132c6b;
    }
LAB_00132ac4:
    uVar3 = object & 0xfffffff;
    if ((object & 0xfff0000) == 0) {
      puVar4 = (uint *)(AtomSpace + (ulong)(uVar3 * 5) * 2);
      pDVar7 = (DLword *)((ulong)((*puVar4 & 0xfffffff) * 2) + (long)Lisp_world);
    }
    else {
      if ((object & 1) == 0) {
        pDVar7 = Lisp_world + (*(uint *)(Lisp_world + uVar3) & 0xfffffff);
      }
      else {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar3);
        pDVar7 = Lisp_world + (*(uint *)(Lisp_world + uVar3) & 0xfffffff);
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar3);
      }
      puVar4 = (uint *)(Lisp_world + uVar3);
    }
    uVar6 = (uint)((ulong)*(undefined8 *)(puVar4 + 3) >> 0x2d) & 1;
    uVar3 = (uint)*(byte *)((ulong)pDVar7 ^ 3);
    uVar5 = 1;
  }
  else {
    if (uVar2 != 0x10) {
      if (uVar2 != 0x15) goto LAB_00132b2e;
      goto LAB_00132ac4;
    }
LAB_00132b02:
    if ((object & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar1);
    }
    if ((Lisp_world[uVar1 + 3] >> 0xc & 1) == 0) goto LAB_00132b2e;
    uVar6 = (uint)((char)Lisp_world[uVar1 + 3] == 'D');
    pDVar7 = Lisp_world + (*(uint *)(Lisp_world + uVar1) & 0xfffffff);
    uVar5 = (ulong)Lisp_world[uVar1 + 2];
    uVar3 = *(uint *)(Lisp_world + uVar1 + 4);
  }
  if (uVar6 == 0) {
    if (uVar3 != 0) {
      uVar5 = uVar5 + (long)pDVar7;
      uVar6 = 0;
      do {
        uVar6 = (uVar6 + (uVar6 & 0xfff) * 4) * 0x101 + (*(byte *)(uVar5 ^ 3) | 0x20);
        uVar5 = uVar5 + 1;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
      goto LAB_00132c6b;
    }
  }
  else if (uVar3 != 0) {
    pDVar7 = pDVar7 + uVar5;
    uVar6 = 0;
    do {
      uVar6 = (uVar6 + (uVar6 & 0xfff) * 4) * 0x101 + (*(ushort *)((ulong)pDVar7 ^ 2) | 0x20);
      pDVar7 = pDVar7 + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    goto LAB_00132c6b;
  }
  uVar6 = 0;
LAB_00132c6b:
  return uVar6 & 0xffff | 0xe0000;
}

Assistant:

LispPTR STRING_EQUAL_HASHBITS(LispPTR object) {
  return (S_POSITIVE | (0xFFFF & (stringequalhash(object))));
}